

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__1&>
               (HighsInt start,HighsInt end,anon_class_24_3_5967739a *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  HighsSplitDeque *pHVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint32_t uVar10;
  int start_00;
  long lVar11;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (grainSize < end - start) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar8 = (long *)__tls_get_addr(&PTR_00441ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar8;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar6 = local_40.workerDeque;
      start_00 = start + end >> 1;
      uVar7 = ((local_40.workerDeque)->ownerData).head;
      uVar9 = (ulong)uVar7;
      if (uVar9 < 0x2000) {
        uVar10 = (uint32_t)(uVar9 + 1);
        ((local_40.workerDeque)->ownerData).head = uVar10;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar9].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData =
             &PTR_operator___004415c8;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 8) = start_00;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0x10) =
             grainSize;
        *(anon_class_24_3_5967739a **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar9].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar9 << 0x20 | uVar9 + 1;
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = uVar10;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
          uVar7 = (pHVar6->ownerData).head;
        }
        (pHVar6->ownerData).head = uVar7 + 1;
        for_each<HEkkDual::majorUpdateFtranFinal()::__1&>(start_00,end,f,grainSize);
      }
      end = start_00;
    } while (grainSize < start_00 - start);
    if (start < start_00) {
      pdVar3 = f->pivot;
      pdVar4 = *f->pivotArray;
      pdVar5 = *f->myRow;
      lVar11 = (long)start;
      do {
        pdVar5[lVar11] = pdVar5[lVar11] - *pdVar3 * pdVar4[lVar11];
        lVar11 = lVar11 + 1;
      } while (start_00 != lVar11);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pdVar3 = f->pivot;
    pdVar4 = *f->pivotArray;
    pdVar5 = *f->myRow;
    lVar11 = (long)start;
    do {
      pdVar5[lVar11] = pdVar5[lVar11] - *pdVar3 * pdVar4[lVar11];
      lVar11 = lVar11 + 1;
    } while (end != lVar11);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}